

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.h
# Opt level: O0

void __thiscall GUIComponent::GUIComponent(GUIComponent *this,GUIComponent *other)

{
  GUIComponent *other_local;
  GUIComponent *this_local;
  
  std::__cxx11::string::string((string *)&this->UniformName);
  this->Type = other->Type;
  this->UniformType = other->UniformType;
  std::__cxx11::string::operator=((string *)&this->UniformName,(string *)&other->UniformName);
  this->IsInUse = (bool)(other->IsInUse & 1);
  this->field_4 = other->field_4;
  *(undefined8 *)this->Data = *(undefined8 *)other->Data;
  *(undefined8 *)(this->Data + 2) = *(undefined8 *)(other->Data + 2);
  return;
}

Assistant:

GUIComponent(const GUIComponent& other) {
        Type = other.Type;
        UniformType = other.UniformType;
        UniformName = other.UniformName;
        IsInUse = other.IsInUse;
        SliderRange = other.SliderRange;
        memcpy(Data, other.Data, sizeof(Data));
    }